

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O0

void Cba_NtkCollectGroupStats(Cba_Ntk_t *p,Vec_Int_t *vObjs,int *pnFins,int *pnFons)

{
  int iVar1;
  int iVar2;
  undefined4 local_38;
  undefined4 local_34;
  int nFons;
  int nFins;
  int iObj;
  int i;
  int *pnFons_local;
  int *pnFins_local;
  Vec_Int_t *vObjs_local;
  Cba_Ntk_t *p_local;
  
  local_34 = 0;
  local_38 = 0;
  for (nFins = 0; iVar1 = Vec_IntSize(vObjs), nFins < iVar1; nFins = nFins + 1) {
    iVar1 = Vec_IntEntry(vObjs,nFins);
    iVar2 = Cba_ObjFinNum(p,iVar1);
    local_34 = iVar2 + local_34;
    iVar1 = Cba_ObjFonNum(p,iVar1);
    local_38 = iVar1 + local_38;
  }
  *pnFins = local_34;
  *pnFons = local_38;
  return;
}

Assistant:

void Cba_NtkCollectGroupStats( Cba_Ntk_t * p, Vec_Int_t * vObjs, int * pnFins, int * pnFons )
{
    int i, iObj, nFins = 0, nFons = 0;
    Vec_IntForEachEntry( vObjs, iObj, i )
    {
        nFins += Cba_ObjFinNum(p, iObj);
        nFons += Cba_ObjFonNum(p, iObj);
    }
    *pnFins = nFins;
    *pnFons = nFons;
}